

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_eval.h
# Opt level: O1

double mp::ComputeValue<mp::VarInfoRecomp>(PLConstraint *con,VarInfoRecomp *x)

{
  double *pdVar1;
  double *pdVar2;
  pointer pdVar3;
  long lVar4;
  PLPoints *this;
  long lVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  this = PLConParams::GetPLPoints
                   (&(con->
                     super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).
                     params_);
  dVar7 = VarVecRecomp::operator[]
                    (&(x->super_VarInfoRecompTypedef).x_,
                     (con->
                     super_CustomConstraintData<std::array<int,_1UL>,_mp::PLConParams,_mp::PLId>).
                     args_._M_elems[0]);
  pdVar1 = (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar9 = *pdVar1;
  if (dVar9 <= dVar7) {
    pdVar2 = (this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
    if (dVar7 < *pdVar2 || dVar7 == *pdVar2) {
      lVar5 = -0x200000000;
      lVar4 = 0;
      do {
        lVar6 = lVar4;
        lVar5 = lVar5 + 0x100000000;
        dVar9 = *(double *)((long)pdVar1 + lVar6);
        lVar4 = lVar6 + 8;
      } while (dVar9 < dVar7);
      if ((dVar9 != dVar7) || (NAN(dVar9) || NAN(dVar7))) {
        pdVar3 = (this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dVar8 = *(double *)((long)pdVar3 + (lVar5 >> 0x1d));
        dVar10 = *(double *)((long)pdVar1 + (lVar5 >> 0x1d));
        dVar8 = ((dVar7 - dVar10) * (*(double *)((long)pdVar3 + lVar6) - dVar8)) / (dVar9 - dVar10)
                + dVar8;
      }
      else {
        dVar8 = *(double *)
                 ((long)(this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar6);
      }
    }
    else {
      dVar8 = (this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish[-1];
      dVar9 = PLPoints::PostSlope(this);
      dVar8 = dVar9 * (dVar7 - (this->x_).super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_finish[-1]) + dVar8;
    }
  }
  else {
    pdVar2 = (this->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar8 = *pdVar2;
    dVar10 = 0.0;
    if ((8 < (ulong)((long)(this->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)pdVar1)) && (dVar9 < pdVar1[1])
       ) {
      dVar10 = (pdVar2[1] - dVar8) / (pdVar1[1] - dVar9);
    }
    dVar8 = dVar8 - (dVar9 - dVar7) * dVar10;
  }
  return dVar8;
}

Assistant:

double ComputeValue(const PLConstraint& con, const VarVec& x) {
  const auto& plp = con.GetParameters().GetPLPoints();
  assert(!plp.empty());
  auto x0 = x[con.GetArguments()[0]];        // position
  if (x0<plp.x_.front())
    return plp.y_.front()
        - plp.PreSlope()*(plp.x_.front() - x0);
  if (x0>plp.x_.back())
    return plp.y_.back()
        + plp.PostSlope()*(x0 - plp.x_.back());
  int i0=0;
  for ( ; x0 > plp.x_[i0]; ++i0) ;
  return plp.x_[i0]==x0
      ? plp.y_[i0]
        : (plp.y_[i0-1]
           + (plp.y_[i0]-plp.y_[i0-1])
        * (x0-plp.x_[i0-1]) / (plp.x_[i0]-plp.x_[i0-1]));
}